

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O0

int lws_plat_BINDTODEVICE(lws_sockfd_type fd,char *ifname)

{
  int iVar1;
  uint *puVar2;
  char local_40 [8];
  ifreq i;
  char *ifname_local;
  lws_sockfd_type fd_local;
  
  i.ifr_ifru._16_8_ = ifname;
  memset(local_40,0,0x28);
  i.ifr_ifrn._8_2_ = 2;
  lws_strncpy(local_40,(char *)i.ifr_ifru._16_8_,0x10);
  iVar1 = setsockopt(fd,1,0x19,local_40,0x28);
  if (iVar1 < 0) {
    puVar2 = (uint *)__errno_location();
    _lws_log(4,"%s: failed %d\n","lws_plat_BINDTODEVICE",(ulong)*puVar2);
  }
  ifname_local._4_4_ = (uint)(iVar1 < 0);
  return ifname_local._4_4_;
}

Assistant:

int
lws_plat_BINDTODEVICE(lws_sockfd_type fd, const char *ifname)
{
#if defined(__linux__)
	struct ifreq i;

	memset(&i, 0, sizeof(i));
	i.ifr_addr.sa_family = AF_INET;
	lws_strncpy(i.ifr_ifrn.ifrn_name, ifname,
		    sizeof(i.ifr_ifrn.ifrn_name));
	if (setsockopt(fd, SOL_SOCKET, SO_BINDTODEVICE, &i, sizeof(i)) < 0) {
		lwsl_notice("%s: failed %d\n", __func__, LWS_ERRNO);
		return 1;
	}

	return 0;
#else
	lwsl_err("%s: UNIMPLEMENTED on this platform\n", __func__);

	return -1;
#endif
}